

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

string * __thiscall
t_netstd_generator::netstd_thrift_usings_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this)

{
  string namespaces;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "using Thrift.Protocol;\nusing Thrift.Protocol.Entities;\nusing Thrift.Protocol.Utilities;\nusing Thrift.Transport;\nusing Thrift.Transport.Client;\nusing Thrift.Transport.Server;\nusing Thrift.Processor;\n"
             ,"");
  std::operator+(__return_storage_ptr__,&local_38,&::endl_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::netstd_thrift_usings() const
{
    string namespaces =
        "using Thrift.Protocol;\n"
        "using Thrift.Protocol.Entities;\n"
        "using Thrift.Protocol.Utilities;\n"
        "using Thrift.Transport;\n"
        "using Thrift.Transport.Client;\n"
        "using Thrift.Transport.Server;\n"
        "using Thrift.Processor;\n";

    return namespaces + endl;
}